

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

node_t_conflict param_type_list(c2m_ctx_t c2m_ctx,int no_err_p)

{
  short sVar1;
  parse_ctx *ppVar2;
  parse_ctx *ppVar3;
  token_t ptVar4;
  node *n;
  node_t_conflict pnVar5;
  node_t_conflict pnVar6;
  node_t_conflict pnVar7;
  size_t mark;
  node_t_conflict op3;
  node_t_conflict op4;
  node *op2;
  pos_t pVar8;
  pos_t pVar9;
  node_t_conflict in_stack_ffffffffffffff98;
  
  ppVar2 = c2m_ctx->parse_ctx;
  n = new_node(c2m_ctx,N_LIST);
  if (*(short *)ppVar2->curr_token != 0x29) {
    do {
      pnVar5 = declaration_specs(c2m_ctx,no_err_p,(node_t_conflict)0x0);
      if (pnVar5 == &err_struct) {
        return &err_struct;
      }
      if ((*(short *)ppVar2->curr_token == 0x2c) || (*(short *)ppVar2->curr_token == 0x29)) {
        pnVar6 = new_node(c2m_ctx,N_IGNORE);
        pnVar7 = new_node(c2m_ctx,N_LIST);
        pnVar6 = new_node2(c2m_ctx,N_DECL,pnVar6,pnVar7);
        pnVar5 = new_node2(c2m_ctx,N_TYPE,pnVar5,pnVar6);
      }
      else {
        mark = record_start(c2m_ctx);
        ppVar3 = c2m_ctx->parse_ctx;
        pnVar6 = abstract_declarator(c2m_ctx,1);
        op2 = &err_struct;
        if (((pnVar6 != &err_struct) &&
            (sVar1 = *(short *)ppVar3->curr_token, op2 = pnVar6, sVar1 != 0x29)) && (sVar1 != 0x2c))
        {
          op2 = &err_struct;
        }
        record_stop(c2m_ctx,mark,(uint)(op2 == &err_struct));
        if (op2 == &err_struct) {
          pnVar6 = declarator(c2m_ctx,no_err_p);
          if (pnVar6 == &err_struct) {
            return &err_struct;
          }
          pnVar7 = try_attr_spec(c2m_ctx,ppVar2->curr_token->pos,(node_t_conflict *)0x0);
          if (pnVar7 == &err_struct) {
            pnVar7 = new_node(c2m_ctx,N_IGNORE);
          }
          pVar9 = get_node_pos(c2m_ctx,&err_struct);
          pVar8.fname = pVar9._8_8_;
          op3 = new_node(c2m_ctx,N_IGNORE);
          op4 = new_node(c2m_ctx,N_IGNORE);
          pVar8._8_8_ = pnVar5;
          pnVar5 = new_pos_node5(c2m_ctx,(node_code_t)pVar9.fname,pVar8,pnVar6,pnVar7,op3,op4,
                                 in_stack_ffffffffffffff98);
        }
        else {
          pnVar5 = new_node2(c2m_ctx,N_TYPE,pnVar5,op2);
        }
      }
      op_append(c2m_ctx,n,pnVar5);
      if (*(short *)c2m_ctx->parse_ctx->curr_token != 0x2c) {
        return n;
      }
      read_token(c2m_ctx);
    } while (*(short *)ppVar2->curr_token != 0x10f);
    ptVar4 = c2m_ctx->parse_ctx->curr_token;
    if (*(short *)ptVar4 == 0x10f) {
      pVar8 = ptVar4->pos;
      read_token(c2m_ctx);
      pnVar5 = new_node(c2m_ctx,N_DOTS);
      add_pos(c2m_ctx,pnVar5,pVar8);
      op_append(c2m_ctx,n,pnVar5);
    }
    else {
      n = &err_struct;
      if (ppVar2->record_level == 0) {
        syntax_error(c2m_ctx,"...");
      }
    }
  }
  return n;
}

Assistant:

D (param_type_list) {
  parse_ctx_t parse_ctx = c2m_ctx->parse_ctx;
  node_t list, attrs, op1, op2, r = err_node;
  int comma_p;
  pos_t pos;

  list = new_node (c2m_ctx, N_LIST);
  if (C (')')) return list;
  for (;;) { /* parameter-list, parameter-declaration */
    PA (declaration_specs, NULL);
    op1 = r;
    if (C (',') || C (')')) {
      r = new_node2 (c2m_ctx, N_TYPE, op1,
                     new_node2 (c2m_ctx, N_DECL, new_node (c2m_ctx, N_IGNORE),
                                new_node (c2m_ctx, N_LIST)));
    } else if ((op2 = TRY (param_type_abstract_declarator)) != err_node) {
      /* Try param_type_abstract_declarator first for possible func
         type case ("<res_type> (<typedef_name>)") which can conflict with declarator ("<res_type>
         (<new decl identifier>)")  */
      r = new_node2 (c2m_ctx, N_TYPE, op1, op2);
    } else {
      P (declarator);
      attrs = try_attr_spec (c2m_ctx, curr_token->pos, NULL);
      if (attrs == err_node) attrs = new_node (c2m_ctx, N_IGNORE);
      r = new_pos_node5 (c2m_ctx, N_SPEC_DECL, POS (op2), op1, r, attrs,
                         new_node (c2m_ctx, N_IGNORE), new_node (c2m_ctx, N_IGNORE));
    }
    op_append (c2m_ctx, list, r);
    comma_p = FALSE;
    if (!M (',')) break;
    comma_p = TRUE;
    if (C (T_DOTS)) break;
  }
  if (comma_p) {
    PTP (T_DOTS, pos);
    op_append (c2m_ctx, list, new_pos_node (c2m_ctx, N_DOTS, pos));
  }
  return list;
}